

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClassNameSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClassNameSyntax *this,size_t index)

{
  Token token;
  ParameterValueAssignmentSyntax *node;
  size_t index_local;
  ClassNameSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->identifier).kind;
    token._2_1_ = (this->identifier).field_0x2;
    token.numFlags.raw = (this->identifier).numFlags.raw;
    token.rawLen = (this->identifier).rawLen;
    token.info = (this->identifier).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = not_null<slang::syntax::ParameterValueAssignmentSyntax_*>::get(&this->parameters);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClassNameSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return identifier;
        case 1: return parameters.get();
        default: return nullptr;
    }
}